

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

void __thiscall cpp_db::transaction::commit(transaction *this)

{
  int iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  bool bVar4;
  
  (*((this->trans_impl).
     super___shared_ptr<cpp_db::transaction_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_transaction_interface[3])();
  tools::do_check<cpp_db::connection_interface>(&this->conn_impl,"Invalid database connection");
  this_00 = (this->conn_impl).
            super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  if (bVar4) {
    peVar3 = (element_type *)0x0;
  }
  else {
    peVar3 = (this->conn_impl).
             super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (*peVar3->_vptr_connection_interface[6])();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void transaction::commit()
{
	trans_impl->commit();
    tools::lock_or_throw(conn_impl, "Invalid database connection")->set_current_transaction(nullptr);
}